

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O0

void __thiscall QPDF::reconstruct_xref(QPDF *this,QPDFExc *e,bool found_startxref)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  long lVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  pointer pMVar5;
  QPDFExc *pQVar6;
  size_type sVar7;
  reference __x;
  element_type *peVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  qpdf_offset_t qVar9;
  undefined4 extraout_var_02;
  char *pcVar10;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  reference pvVar11;
  reference __t;
  __tuple_element_t<2UL,_tuple<int,_int,_long_long>_> *p_Var12;
  longlong xref_offset;
  reference ptVar13;
  __tuple_element_t<0UL,_tuple<int,_int,_long_long>_> *p_Var14;
  __tuple_element_t<1UL,_tuple<int,_int,_long_long>_> *p_Var15;
  reference plVar16;
  reference ppVar17;
  byte local_f0b;
  byte local_f0a;
  bool local_df1;
  bool local_dd2;
  bool local_d92;
  allocator<char> local_d19;
  string local_d18;
  allocator<char> local_cf1;
  string local_cf0;
  undefined1 local_cca;
  allocator<char> local_cc9;
  string local_cc8;
  allocator<char> local_ca1;
  string local_ca0;
  undefined1 local_c7a;
  allocator<char> local_c79;
  string local_c78;
  allocator<char> local_c51;
  string local_c50;
  allocator<char> local_c29;
  string local_c28;
  QPDFObjectHandle local_c08;
  allocator<char> local_bf1;
  string local_bf0;
  allocator<char> local_bc9;
  string local_bc8;
  QPDFExc local_ba8;
  exception *anon_var_0_2;
  allocator<char> local_b09;
  string local_b08;
  allocator<char> local_ae1;
  string local_ae0;
  QPDFObjectHandle local_ac0;
  reference local_ab0;
  pair<const_QPDFObjGen,_QPDF::ObjCache> *iter_3;
  iterator __end2_1;
  iterator __begin2_1;
  map<QPDFObjGen,_QPDF::ObjCache,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
  *__range2_1;
  QPDFObjectHandle root;
  string local_a78 [32];
  QPDFObjectHandle local_a58 [14];
  exception *anon_var_0_1;
  allocator<char> local_959;
  string local_958 [32];
  string local_938;
  uint local_914;
  size_t sStack_910;
  uint size;
  qpdf_offset_t offset_1;
  exception *anon_var_0;
  string local_8f8;
  allocator<char> local_8d1;
  string local_8d0;
  QPDFObjGen local_8b0;
  undefined1 local_8a8 [8];
  QPDFObjectHandle oh;
  QPDFXRefEntry entry;
  pair<const_QPDFObjGen,_QPDFXRefEntry> *iter_2;
  iterator __end2;
  iterator __begin2;
  map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
  *__range2;
  size_t max_size;
  qpdf_offset_t max_offset;
  allocator<char> local_839;
  string local_838;
  allocator<char> local_811;
  string local_810;
  QPDFExc local_7f0;
  allocator<char> local_769;
  string local_768;
  undefined1 local_748 [8];
  QPDFObjectHandle t;
  reverse_iterator it_1;
  type_conflict1 *token_start_1;
  type_conflict4 *gen_1;
  type_conflict4 *obj_1;
  undefined8 uStack_700;
  undefined1 local_6f8 [8];
  reverse_iterator it;
  reverse_iterator rend;
  string local_6e0;
  allocator<char> local_6b9;
  string local_6b8;
  QPDFExc local_698;
  allocator<char> local_611;
  string local_610 [32];
  string local_5f0;
  Token local_5d0;
  longlong local_568;
  longlong offset;
  byte local_553;
  byte local_552;
  allocator<char> local_551;
  string local_550;
  longlong local_530;
  byte local_523;
  byte local_522;
  allocator<char> local_521;
  string local_520;
  string local_500;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e0;
  allocator<char> local_4b9;
  string local_4b8;
  QPDFExc local_498;
  int local_414;
  int local_410;
  int gen;
  int obj;
  byte local_3e1;
  Token local_3e0;
  undefined1 local_378 [8];
  Token t2;
  qpdf_offset_t pos;
  long local_300;
  qpdf_offset_t token_start;
  Token t1;
  qpdf_offset_t eof;
  vector<long_long,_std::allocator<long_long>_> startxrefs;
  vector<long_long,_std::allocator<long_long>_> trailers;
  vector<std::tuple<int,_int,_long_long>,_std::allocator<std::tuple<int,_int,_long_long>_>_>
  found_objects;
  QPDFObjGen *iter_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<QPDFObjGen,_std::allocator<QPDFObjGen>_> *__range1_1;
  pair<const_QPDFObjGen,_QPDFXRefEntry> *iter;
  iterator __end1;
  iterator __begin1;
  map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
  *__range1;
  vector<QPDFObjGen,_std::allocator<QPDFObjGen>_> to_delete;
  string local_1e0;
  allocator<char> local_1b9;
  string local_1b8;
  QPDFExc local_198;
  allocator<char> local_111;
  string local_110;
  allocator<char> local_e9;
  string local_e8;
  QPDFExc local_c8;
  undefined1 local_48 [8];
  anon_class_16_2_2ef5c38d check_warnings;
  size_type max_warnings;
  bool found_startxref_local;
  QPDFExc *e_local;
  QPDF *this_local;
  
  pMVar5 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  if ((pMVar5->reconstructed_xref & 1U) != 0) {
    pQVar6 = (QPDFExc *)__cxa_allocate_exception(0x80);
    QPDFExc::QPDFExc(pQVar6,e);
    __cxa_throw(pQVar6,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
  }
  pMVar5 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  sVar7 = std::vector<QPDFExc,_std::allocator<QPDFExc>_>::size(&pMVar5->warnings);
  check_warnings.this = (QPDF *)(sVar7 + 1000);
  local_48 = (undefined1  [8])this;
  check_warnings.max_warnings = (size_type)check_warnings.this;
  pMVar5 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  pMVar5->reconstructed_xref = true;
  pMVar5 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  pMVar5->fixed_dangling_refs = false;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"",&local_e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,"file is damaged",&local_111);
  damagedPDF(&local_c8,this,&local_e8,-1,&local_110);
  warn(this,&local_c8);
  QPDFExc::~QPDFExc(&local_c8);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator(&local_111);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator(&local_e9);
  warn(this,e);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b8,"",&local_1b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e0,"Attempting to reconstruct cross-reference table",
             (allocator<char> *)
             ((long)&to_delete.super__Vector_base<QPDFObjGen,_std::allocator<QPDFObjGen>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  damagedPDF(&local_198,this,&local_1b8,-1,&local_1e0);
  warn(this,&local_198);
  QPDFExc::~QPDFExc(&local_198);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&to_delete.super__Vector_base<QPDFObjGen,_std::allocator<QPDFObjGen>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::__cxx11::string::~string((string *)&local_1b8);
  std::allocator<char>::~allocator(&local_1b9);
  std::vector<QPDFObjGen,_std::allocator<QPDFObjGen>_>::vector
            ((vector<QPDFObjGen,_std::allocator<QPDFObjGen>_> *)&__range1);
  pMVar5 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  __end1 = std::
           map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
           ::begin(&pMVar5->xref_table);
  iter = (pair<const_QPDFObjGen,_QPDFXRefEntry> *)
         std::
         map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
         ::end(&pMVar5->xref_table);
  while (bVar2 = std::operator!=(&__end1,(_Self *)&iter), bVar2) {
    ppVar17 = std::_Rb_tree_iterator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>::operator*
                        (&__end1);
    iVar3 = QPDFXRefEntry::getType(&ppVar17->second);
    if (iVar3 == 1) {
      std::vector<QPDFObjGen,std::allocator<QPDFObjGen>>::emplace_back<QPDFObjGen_const&>
                ((vector<QPDFObjGen,std::allocator<QPDFObjGen>> *)&__range1,&ppVar17->first);
    }
    std::_Rb_tree_iterator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>::operator++(&__end1);
  }
  __end1_1 = std::vector<QPDFObjGen,_std::allocator<QPDFObjGen>_>::begin
                       ((vector<QPDFObjGen,_std::allocator<QPDFObjGen>_> *)&__range1);
  iter_1 = (QPDFObjGen *)
           std::vector<QPDFObjGen,_std::allocator<QPDFObjGen>_>::end
                     ((vector<QPDFObjGen,_std::allocator<QPDFObjGen>_> *)&__range1);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<QPDFObjGen_*,_std::vector<QPDFObjGen,_std::allocator<QPDFObjGen>_>_>
                             *)&iter_1), bVar2) {
    __x = __gnu_cxx::
          __normal_iterator<QPDFObjGen_*,_std::vector<QPDFObjGen,_std::allocator<QPDFObjGen>_>_>::
          operator*(&__end1_1);
    pMVar5 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    std::
    map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
    ::erase(&pMVar5->xref_table,__x);
    __gnu_cxx::
    __normal_iterator<QPDFObjGen_*,_std::vector<QPDFObjGen,_std::allocator<QPDFObjGen>_>_>::
    operator++(&__end1_1);
  }
  std::vector<std::tuple<int,_int,_long_long>,_std::allocator<std::tuple<int,_int,_long_long>_>_>::
  vector((vector<std::tuple<int,_int,_long_long>,_std::allocator<std::tuple<int,_int,_long_long>_>_>
          *)&trailers.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  std::vector<long_long,_std::allocator<long_long>_>::vector
            ((vector<long_long,_std::allocator<long_long>_> *)
             &startxrefs.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<long_long,_std::allocator<long_long>_>::vector
            ((vector<long_long,_std::allocator<long_long>_> *)&eof);
  pMVar5 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  peVar8 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &pMVar5->file);
  (*peVar8->_vptr_InputSource[5])(peVar8,0,2);
  pMVar5 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  peVar8 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &pMVar5->file);
  iVar3 = (*peVar8->_vptr_InputSource[4])();
  t1.error_message.field_2._8_8_ = CONCAT44(extraout_var,iVar3);
  pMVar5 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  peVar8 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &pMVar5->file);
  (*peVar8->_vptr_InputSource[5])(peVar8,0);
  while( true ) {
    pMVar5 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    peVar8 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&pMVar5->file);
    iVar3 = (*peVar8->_vptr_InputSource[4])();
    if ((long)t1.error_message.field_2._8_8_ <= CONCAT44(extraout_var_00,iVar3)) break;
    pMVar5 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    peVar8 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator*((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                       )&pMVar5->file);
    readToken((Token *)&token_start,this,peVar8,10);
    pMVar5 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    peVar8 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&pMVar5->file);
    iVar3 = (*peVar8->_vptr_InputSource[4])();
    QPDFTokenizer::Token::getValue_abi_cxx11_((Token *)&token_start);
    pos = std::__cxx11::string::length();
    qVar9 = toO<unsigned_long>((unsigned_long *)&pos);
    local_300 = CONCAT44(extraout_var_01,iVar3) - qVar9;
    bVar2 = QPDFTokenizer::Token::isInteger((Token *)&token_start);
    if (bVar2) {
      pMVar5 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                         (&this->m);
      peVar8 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&pMVar5->file);
      iVar3 = (*peVar8->_vptr_InputSource[4])();
      t2.error_message.field_2._8_8_ = CONCAT44(extraout_var_02,iVar3);
      pMVar5 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                         (&this->m);
      peVar8 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator*((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&pMVar5->file);
      readToken((Token *)local_378,this,peVar8,10);
      local_3e1 = 0;
      gen._2_1_ = 0;
      gen._1_1_ = 0;
      bVar2 = QPDFTokenizer::Token::isInteger((Token *)local_378);
      local_d92 = false;
      if (bVar2) {
        pMVar5 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                           (&this->m);
        peVar8 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator*((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&pMVar5->file);
        readToken(&local_3e0,this,peVar8,10);
        local_3e1 = 1;
        std::allocator<char>::allocator();
        gen._2_1_ = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&obj,"obj",(allocator<char> *)((long)&gen + 3));
        gen._1_1_ = 1;
        local_d92 = QPDFTokenizer::Token::isWord(&local_3e0,(string *)&obj);
      }
      if ((gen._1_1_ & 1) != 0) {
        std::__cxx11::string::~string((string *)&obj);
      }
      if ((gen._2_1_ & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)((long)&gen + 3));
      }
      if ((local_3e1 & 1) != 0) {
        QPDFTokenizer::Token::~Token(&local_3e0);
      }
      if (local_d92 != false) {
        QPDFTokenizer::Token::getValue_abi_cxx11_((Token *)&token_start);
        pcVar10 = (char *)std::__cxx11::string::c_str();
        local_410 = QUtil::string_to_int(pcVar10);
        QPDFTokenizer::Token::getValue_abi_cxx11_((Token *)local_378);
        pcVar10 = (char *)std::__cxx11::string::c_str();
        local_414 = QUtil::string_to_int(pcVar10);
        iVar3 = local_410;
        pMVar5 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                           (&this->m);
        if (pMVar5->xref_table_max_id < iVar3) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_4b8,"",&local_4b9);
          std::__cxx11::to_string(&local_500,local_410);
          std::operator+(&local_4e0,"ignoring object with impossibly large id ",&local_500);
          damagedPDF(&local_498,this,&local_4b8,-1,&local_4e0);
          warn(this,&local_498);
          QPDFExc::~QPDFExc(&local_498);
          std::__cxx11::string::~string((string *)&local_4e0);
          std::__cxx11::string::~string((string *)&local_500);
          std::__cxx11::string::~string((string *)&local_4b8);
          std::allocator<char>::~allocator(&local_4b9);
        }
        else {
          std::vector<std::tuple<int,int,long_long>,std::allocator<std::tuple<int,int,long_long>>>::
          emplace_back<int&,int&,long_long&>
                    ((vector<std::tuple<int,int,long_long>,std::allocator<std::tuple<int,int,long_long>>>
                      *)&trailers.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,&local_410,&local_414,&local_300)
          ;
        }
      }
      pMVar5 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                         (&this->m);
      peVar8 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&pMVar5->file);
      (*peVar8->_vptr_InputSource[5])(peVar8,t2.error_message.field_2._8_8_,0);
      QPDFTokenizer::Token::~Token((Token *)local_378);
    }
    else {
      pMVar5 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                         (&this->m);
      local_522 = 0;
      local_523 = 0;
      bVar2 = ::qpdf::BaseHandle::operator_cast_to_bool(&(pMVar5->trailer).super_BaseHandle);
      local_dd2 = false;
      if (!bVar2) {
        std::allocator<char>::allocator();
        local_522 = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_520,"trailer",&local_521);
        local_523 = 1;
        local_dd2 = QPDFTokenizer::Token::isWord((Token *)&token_start,&local_520);
      }
      if ((local_523 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_520);
      }
      if ((local_522 & 1) != 0) {
        std::allocator<char>::~allocator(&local_521);
      }
      if (local_dd2 == false) {
        local_552 = 0;
        local_553 = 0;
        local_df1 = false;
        if (!found_startxref) {
          std::allocator<char>::allocator();
          local_552 = 1;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_550,"startxref",&local_551);
          local_553 = 1;
          local_df1 = QPDFTokenizer::Token::isWord((Token *)&token_start,&local_550);
        }
        if ((local_553 & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_550);
        }
        if ((local_552 & 1) != 0) {
          std::allocator<char>::~allocator(&local_551);
        }
        if (local_df1 != false) {
          pMVar5 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                             (&this->m);
          peVar8 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&pMVar5->file);
          iVar3 = (*peVar8->_vptr_InputSource[4])();
          offset = CONCAT44(extraout_var_04,iVar3);
          std::vector<long_long,_std::allocator<long_long>_>::emplace_back<long_long>
                    ((vector<long_long,_std::allocator<long_long>_> *)&eof,&offset);
        }
      }
      else {
        pMVar5 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                           (&this->m);
        peVar8 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&pMVar5->file);
        iVar3 = (*peVar8->_vptr_InputSource[4])();
        local_530 = CONCAT44(extraout_var_03,iVar3);
        std::vector<long_long,_std::allocator<long_long>_>::emplace_back<long_long>
                  ((vector<long_long,_std::allocator<long_long>_> *)
                   &startxrefs.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,&local_530);
      }
    }
    reconstruct_xref::anon_class_16_2_2ef5c38d::operator()((anon_class_16_2_2ef5c38d *)local_48);
    pMVar5 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    peVar8 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&pMVar5->file);
    (*peVar8->_vptr_InputSource[2])();
    QPDFTokenizer::Token::~Token((Token *)&token_start);
  }
  if (((!found_startxref) &&
      (bVar2 = std::vector<long_long,_std::allocator<long_long>_>::empty
                         ((vector<long_long,_std::allocator<long_long>_> *)&eof), !bVar2)) &&
     (bVar2 = std::
              vector<std::tuple<int,_int,_long_long>,_std::allocator<std::tuple<int,_int,_long_long>_>_>
              ::empty((vector<std::tuple<int,_int,_long_long>,_std::allocator<std::tuple<int,_int,_long_long>_>_>
                       *)&trailers.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage), !bVar2)) {
    pvVar11 = std::vector<long_long,_std::allocator<long_long>_>::back
                        ((vector<long_long,_std::allocator<long_long>_> *)&eof);
    lVar1 = *pvVar11;
    __t = std::
          vector<std::tuple<int,_int,_long_long>,_std::allocator<std::tuple<int,_int,_long_long>_>_>
          ::back((vector<std::tuple<int,_int,_long_long>,_std::allocator<std::tuple<int,_int,_long_long>_>_>
                  *)&trailers.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
    p_Var12 = std::get<2ul,int,int,long_long>(__t);
    if (*p_Var12 < lVar1) {
      pMVar5 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                         (&this->m);
      peVar8 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&pMVar5->file);
      pvVar11 = std::vector<long_long,_std::allocator<long_long>_>::back
                          ((vector<long_long,_std::allocator<long_long>_> *)&eof);
      (*peVar8->_vptr_InputSource[5])(peVar8,*pvVar11,0);
      pMVar5 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                         (&this->m);
      peVar8 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator*((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&pMVar5->file);
      readToken(&local_5d0,this,peVar8,0);
      QPDFTokenizer::Token::getValue_abi_cxx11_(&local_5d0);
      pcVar10 = (char *)std::__cxx11::string::data();
      xref_offset = QUtil::string_to_ll(pcVar10);
      QPDFTokenizer::Token::~Token(&local_5d0);
      local_568 = xref_offset;
      if (xref_offset != 0) {
        read_xref(this,xref_offset);
        getRoot((QPDF *)&local_5f0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_610,"/Pages",&local_611);
        QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_5f0.field_2,&local_5f0);
        bVar2 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)&local_5f0.field_2);
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&local_5f0.field_2);
        std::__cxx11::string::~string(local_610);
        std::allocator<char>::~allocator(&local_611);
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&local_5f0);
        if (bVar2) {
          QTC::TC("qpdf","QPDF startxref more than 1024 before end",0);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_6b8,"",&local_6b9);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_6e0,"startxref was more than 1024 bytes before end of file",
                     (allocator<char> *)((long)&rend.current._M_current + 7));
          damagedPDF(&local_698,this,&local_6b8,-1,&local_6e0);
          warn(this,&local_698);
          QPDFExc::~QPDFExc(&local_698);
          std::__cxx11::string::~string((string *)&local_6e0);
          std::allocator<char>::~allocator((allocator<char> *)((long)&rend.current._M_current + 7));
          std::__cxx11::string::~string((string *)&local_6b8);
          std::allocator<char>::~allocator(&local_6b9);
          initializeEncryption(this);
          pMVar5 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                             (&this->m);
          pMVar5->parsed = true;
          pMVar5 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                             (&this->m);
          pMVar5->reconstructed_xref = false;
          rend.current._M_current._0_4_ = 1;
          goto LAB_0037e151;
        }
      }
    }
  }
  std::vector<std::tuple<int,_int,_long_long>,_std::allocator<std::tuple<int,_int,_long_long>_>_>::
  rend((vector<std::tuple<int,_int,_long_long>,_std::allocator<std::tuple<int,_int,_long_long>_>_> *
       )&it);
  std::vector<std::tuple<int,_int,_long_long>,_std::allocator<std::tuple<int,_int,_long_long>_>_>::
  rbegin((vector<std::tuple<int,_int,_long_long>,_std::allocator<std::tuple<int,_int,_long_long>_>_>
          *)local_6f8);
  while (bVar2 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<std::tuple<int,_int,_long_long>_*,_std::vector<std::tuple<int,_int,_long_long>,_std::allocator<std::tuple<int,_int,_long_long>_>_>_>_>
                                  *)local_6f8,&it), bVar2) {
    ptVar13 = std::
              reverse_iterator<__gnu_cxx::__normal_iterator<std::tuple<int,_int,_long_long>_*,_std::vector<std::tuple<int,_int,_long_long>,_std::allocator<std::tuple<int,_int,_long_long>_>_>_>_>
              ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<std::tuple<int,_int,_long_long>_*,_std::vector<std::tuple<int,_int,_long_long>,_std::allocator<std::tuple<int,_int,_long_long>_>_>_>_>
                           *)local_6f8);
    obj_1 = (type_conflict4 *)
            (ptVar13->super__Tuple_impl<0UL,_int,_int,_long_long>).
            super__Tuple_impl<1UL,_int,_long_long>.super__Tuple_impl<2UL,_long_long>.
            super__Head_base<2UL,_long_long,_false>._M_head_impl;
    uStack_700._0_4_ =
         (ptVar13->super__Tuple_impl<0UL,_int,_int,_long_long>).
         super__Tuple_impl<1UL,_int,_long_long>.super__Head_base<1UL,_int,_false>._M_head_impl;
    uStack_700._4_4_ =
         *(undefined4 *)
          &(ptVar13->super__Tuple_impl<0UL,_int,_int,_long_long>).
           super__Tuple_impl<1UL,_int,_long_long>.field_0xc;
    p_Var14 = std::get<0ul,int,int,long_long>((tuple<int,_int,_long_long> *)&obj_1);
    p_Var15 = std::get<1ul,int,int,long_long>((tuple<int,_int,_long_long> *)&obj_1);
    p_Var12 = std::get<2ul,int,int,long_long>((tuple<int,_int,_long_long> *)&obj_1);
    insertXrefEntry(this,*p_Var14,1,*p_Var12,*p_Var15);
    reconstruct_xref::anon_class_16_2_2ef5c38d::operator()((anon_class_16_2_2ef5c38d *)local_48);
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<std::tuple<int,_int,_long_long>_*,_std::vector<std::tuple<int,_int,_long_long>,_std::allocator<std::tuple<int,_int,_long_long>_>_>_>_>
    ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<std::tuple<int,_int,_long_long>_*,_std::vector<std::tuple<int,_int,_long_long>,_std::allocator<std::tuple<int,_int,_long_long>_>_>_>_>
                  *)&it_1,(int)local_6f8);
  }
  pMVar5 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  std::set<int,_std::less<int>,_std::allocator<int>_>::clear(&pMVar5->deleted_objects);
  std::vector<long_long,_std::allocator<long_long>_>::rbegin
            ((vector<long_long,_std::allocator<long_long>_> *)&stack0xfffffffffffff8d0);
  while( true ) {
    this_00 = &t.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount;
    std::vector<long_long,_std::allocator<long_long>_>::rend
              ((vector<long_long,_std::allocator<long_long>_> *)this_00);
    bVar2 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_>_>
                             *)&stack0xfffffffffffff8d0,
                            (reverse_iterator<__gnu_cxx::__normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_>_>
                             *)this_00);
    if (!bVar2) break;
    pMVar5 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    peVar8 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&pMVar5->file);
    plVar16 = std::
              reverse_iterator<__gnu_cxx::__normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_>_>
              ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_>_>
                           *)&stack0xfffffffffffff8d0);
    (*peVar8->_vptr_InputSource[5])(peVar8,*plVar16,0);
    readTrailer((QPDF *)local_748);
    bVar2 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)local_748);
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_768,"/Root",&local_769);
      bVar2 = QPDFObjectHandle::hasKey((QPDFObjectHandle *)local_748,&local_768);
      std::__cxx11::string::~string((string *)&local_768);
      std::allocator<char>::~allocator(&local_769);
      if (!bVar2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_810,"trailer",&local_811);
        plVar16 = std::
                  reverse_iterator<__gnu_cxx::__normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_>_>
                  ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_>_>
                               *)&stack0xfffffffffffff8d0);
        qVar9 = *plVar16;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_838,"recovered trailer has no /Root entry",&local_839);
        damagedPDF(&local_7f0,this,&local_810,qVar9,&local_838);
        warn(this,&local_7f0);
        QPDFExc::~QPDFExc(&local_7f0);
        std::__cxx11::string::~string((string *)&local_838);
        std::allocator<char>::~allocator(&local_839);
        std::__cxx11::string::~string((string *)&local_810);
        std::allocator<char>::~allocator(&local_811);
        goto LAB_0037cecb;
      }
      pMVar5 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                         (&this->m);
      QPDFObjectHandle::operator=(&pMVar5->trailer,(QPDFObjectHandle *)local_748);
      rend.current._M_current._0_4_ = 0xb;
    }
    else {
LAB_0037cecb:
      reconstruct_xref::anon_class_16_2_2ef5c38d::operator()((anon_class_16_2_2ef5c38d *)local_48);
      rend.current._M_current._0_4_ = 0;
    }
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_748);
    if ((int)rend.current._M_current != 0) break;
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_>_>
    ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_>_>
                  *)&max_offset,(int)&stack0xfffffffffffff8d0);
  }
  pMVar5 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  bVar2 = ::qpdf::BaseHandle::operator_cast_to_bool(&(pMVar5->trailer).super_BaseHandle);
  if (!bVar2) {
    max_size = 0;
    pMVar5 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    __end2 = std::
             map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
             ::begin(&pMVar5->xref_table);
    iter_2 = (pair<const_QPDFObjGen,_QPDFXRefEntry> *)
             std::
             map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
             ::end(&pMVar5->xref_table);
    while (bVar2 = std::operator!=(&__end2,(_Self *)&iter_2), bVar2) {
      ppVar17 = std::_Rb_tree_iterator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>::operator*
                          (&__end2);
      oh.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&ppVar17->second;
      iVar3 = QPDFXRefEntry::getType
                        ((QPDFXRefEntry *)
                         &oh.super_BaseHandle.obj.
                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      if (iVar3 == 1) {
        local_8b0 = ppVar17->first;
        getObject((QPDF *)local_8a8,(QPDFObjGen)this);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_8d0,"/XRef",&local_8d1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_8f8,"",(allocator<char> *)((long)&anon_var_0 + 7));
        bVar2 = QPDFObjectHandle::isStreamOfType
                          ((QPDFObjectHandle *)local_8a8,&local_8d0,&local_8f8);
        std::__cxx11::string::~string((string *)&local_8f8);
        std::allocator<char>::~allocator((allocator<char> *)((long)&anon_var_0 + 7));
        std::__cxx11::string::~string((string *)&local_8d0);
        std::allocator<char>::~allocator(&local_8d1);
        if (((bVar2 ^ 0xffU) & 1) == 0) {
          sStack_910 = QPDFXRefEntry::getOffset
                                 ((QPDFXRefEntry *)
                                  &oh.super_BaseHandle.obj.
                                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount);
          QPDFObjectHandle::getDict((QPDFObjectHandle *)&local_938);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>(local_958,"/Size",&local_959);
          QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_938.field_2,&local_938);
          uVar4 = QPDFObjectHandle::getUIntValueAsUInt((QPDFObjectHandle *)&local_938.field_2);
          QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&local_938.field_2);
          std::__cxx11::string::~string(local_958);
          std::allocator<char>::~allocator(&local_959);
          QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&local_938);
          local_914 = uVar4;
          if ((uVar4 != 0) || ((long)max_size < (long)sStack_910)) {
            max_size = sStack_910;
            QPDFObjectHandle::getDict((QPDFObjectHandle *)&anon_var_0_1);
            setTrailer(this,(QPDFObjectHandle *)&anon_var_0_1);
            QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&anon_var_0_1);
          }
          reconstruct_xref::anon_class_16_2_2ef5c38d::operator()
                    ((anon_class_16_2_2ef5c38d *)local_48);
          rend.current._M_current._0_4_ = 0;
        }
        else {
          rend.current._M_current._0_4_ = 0xf;
        }
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_8a8);
      }
      std::_Rb_tree_iterator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>::operator++(&__end2);
    }
    if (0 < (long)max_size) {
      read_xref(this,max_size);
      QTC::TC("qpdf","QPDF recover xref stream",0);
    }
  }
  pMVar5 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  root.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._6_1_ = 0;
  root.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._5_1_ = 0;
  root.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._4_1_ = 0;
  bVar2 = ::qpdf::BaseHandle::operator_cast_to_bool(&(pMVar5->trailer).super_BaseHandle);
  local_f0a = 1;
  if (bVar2) {
    pMVar5 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    local_f0b = 0;
    if ((pMVar5->parsed & 1U) == 0) {
      pMVar5 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                         (&this->m);
      std::allocator<char>::allocator();
      root.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi._6_1_ = 1;
      std::__cxx11::string::string<std::allocator<char>>
                (local_a78,"/Root",
                 (allocator<char> *)
                 ((long)&root.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi + 7));
      root.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi._5_1_ = 1;
      QPDFObjectHandle::getKey(local_a58,(string *)&pMVar5->trailer);
      root.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi._4_1_ = 1;
      bVar2 = QPDFObjectHandle::isDictionary(local_a58);
      local_f0b = bVar2 ^ 0xff;
    }
    local_f0a = local_f0b;
  }
  if ((root.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi._4_1_ & 1) != 0) {
    QPDFObjectHandle::~QPDFObjectHandle(local_a58);
  }
  if ((root.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi._5_1_ & 1) != 0) {
    std::__cxx11::string::~string(local_a78);
  }
  if ((root.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi._6_1_ & 1) != 0) {
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&root.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               + 7));
  }
  if ((local_f0a & 1) != 0) {
    QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)&__range2_1);
    pMVar5 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    __end2_1 = std::
               map<QPDFObjGen,_QPDF::ObjCache,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
               ::begin(&pMVar5->obj_cache);
    iter_3 = (pair<const_QPDFObjGen,_QPDF::ObjCache> *)
             std::
             map<QPDFObjGen,_QPDF::ObjCache,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
             ::end(&pMVar5->obj_cache);
    while (bVar2 = std::operator!=(&__end2_1,(_Self *)&iter_3), bVar2) {
      local_ab0 = std::_Rb_tree_iterator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>::operator*
                            (&__end2_1);
      QPDFObjectHandle::QPDFObjectHandle(&local_ac0,&(local_ab0->second).object);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_ae0,"/Catalog",&local_ae1)
      ;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_b08,"",&local_b09);
      bVar2 = QPDFObjectHandle::isDictionaryOfType(&local_ac0,&local_ae0,&local_b08);
      std::__cxx11::string::~string((string *)&local_b08);
      std::allocator<char>::~allocator(&local_b09);
      std::__cxx11::string::~string((string *)&local_ae0);
      std::allocator<char>::~allocator(&local_ae1);
      QPDFObjectHandle::~QPDFObjectHandle(&local_ac0);
      if (bVar2) {
        QPDFObjectHandle::QPDFObjectHandle
                  ((QPDFObjectHandle *)&anon_var_0_2,&(local_ab0->second).object);
        QPDFObjectHandle::operator=
                  ((QPDFObjectHandle *)&__range2_1,(QPDFObjectHandle *)&anon_var_0_2);
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&anon_var_0_2);
      }
      std::_Rb_tree_iterator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>::operator++(&__end2_1);
    }
    bVar2 = ::qpdf::BaseHandle::operator_cast_to_bool((BaseHandle *)&__range2_1);
    if (bVar2) {
      pMVar5 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                         (&this->m);
      bVar2 = ::qpdf::BaseHandle::operator_cast_to_bool(&(pMVar5->trailer).super_BaseHandle);
      if (!bVar2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_bc8,"",&local_bc9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_bf0,
                   "unable to find trailer dictionary while recovering damaged file",&local_bf1);
        damagedPDF(&local_ba8,this,&local_bc8,-1,&local_bf0);
        warn(this,&local_ba8);
        QPDFExc::~QPDFExc(&local_ba8);
        std::__cxx11::string::~string((string *)&local_bf0);
        std::allocator<char>::~allocator(&local_bf1);
        std::__cxx11::string::~string((string *)&local_bc8);
        std::allocator<char>::~allocator(&local_bc9);
        QPDFObjectHandle::newDictionary();
        pMVar5 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                           (&this->m);
        QPDFObjectHandle::operator=(&pMVar5->trailer,&local_c08);
        QPDFObjectHandle::~QPDFObjectHandle(&local_c08);
      }
      pMVar5 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                         (&this->m);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_c28,"/Root",&local_c29);
      QPDFObjectHandle::replaceKey(&pMVar5->trailer,&local_c28,(QPDFObjectHandle *)&__range2_1);
      std::__cxx11::string::~string((string *)&local_c28);
      std::allocator<char>::~allocator(&local_c29);
    }
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&__range2_1);
  }
  pMVar5 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  bVar2 = ::qpdf::BaseHandle::operator_cast_to_bool(&(pMVar5->trailer).super_BaseHandle);
  if (!bVar2) {
    local_c7a = 1;
    pQVar6 = (QPDFExc *)__cxa_allocate_exception(0x80);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c50,"",&local_c51);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c78,
               "unable to find trailer dictionary while recovering damaged file",&local_c79);
    damagedPDF(pQVar6,this,&local_c50,-1,&local_c78);
    local_c7a = 0;
    __cxa_throw(pQVar6,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
  }
  pMVar5 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  bVar2 = std::
          map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
          ::empty(&pMVar5->xref_table);
  if (bVar2) {
    local_cca = 1;
    pQVar6 = (QPDFExc *)__cxa_allocate_exception(0x80);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_ca0,"",&local_ca1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_cc8,"unable to find objects while recovering damaged file",
               &local_cc9);
    damagedPDF(pQVar6,this,&local_ca0,-1,&local_cc8);
    local_cca = 0;
    __cxa_throw(pQVar6,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
  }
  reconstruct_xref::anon_class_16_2_2ef5c38d::operator()((anon_class_16_2_2ef5c38d *)local_48);
  pMVar5 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  if ((pMVar5->parsed & 1U) == 0) {
    pMVar5 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    pMVar5->parsed = true;
    getAllPages(this);
    reconstruct_xref::anon_class_16_2_2ef5c38d::operator()((anon_class_16_2_2ef5c38d *)local_48);
    pMVar5 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    bVar2 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::empty
                      (&pMVar5->all_pages);
    if (bVar2) {
      pMVar5 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                         (&this->m);
      pMVar5->parsed = false;
      pQVar6 = (QPDFExc *)__cxa_allocate_exception(0x80);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_cf0,"",&local_cf1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d18,"unable to find any pages while recovering damaged file",
                 &local_d19);
      damagedPDF(pQVar6,this,&local_cf0,-1,&local_d18);
      __cxa_throw(pQVar6,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
    }
  }
  rend.current._M_current._0_4_ = 0;
LAB_0037e151:
  std::vector<long_long,_std::allocator<long_long>_>::~vector
            ((vector<long_long,_std::allocator<long_long>_> *)&eof);
  std::vector<long_long,_std::allocator<long_long>_>::~vector
            ((vector<long_long,_std::allocator<long_long>_> *)
             &startxrefs.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<std::tuple<int,_int,_long_long>,_std::allocator<std::tuple<int,_int,_long_long>_>_>::
  ~vector((vector<std::tuple<int,_int,_long_long>,_std::allocator<std::tuple<int,_int,_long_long>_>_>
           *)&trailers.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<QPDFObjGen,_std::allocator<QPDFObjGen>_>::~vector
            ((vector<QPDFObjGen,_std::allocator<QPDFObjGen>_> *)&__range1);
  return;
}

Assistant:

void
QPDF::reconstruct_xref(QPDFExc& e, bool found_startxref)
{
    if (m->reconstructed_xref) {
        // Avoid xref reconstruction infinite loops. This is getting very hard to reproduce because
        // qpdf is throwing many fewer exceptions while parsing. Most situations are warnings now.
        throw e;
    }

    // If recovery generates more than 1000 warnings, the file is so severely damaged that there
    // probably is no point trying to continue.
    const auto max_warnings = m->warnings.size() + 1000U;
    auto check_warnings = [this, max_warnings]() {
        if (m->warnings.size() > max_warnings) {
            throw damagedPDF("", -1, "too many errors while reconstructing cross-reference table");
        }
    };

    m->reconstructed_xref = true;
    // We may find more objects, which may contain dangling references.
    m->fixed_dangling_refs = false;

    warn(damagedPDF("", -1, "file is damaged"));
    warn(e);
    warn(damagedPDF("", -1, "Attempting to reconstruct cross-reference table"));

    // Delete all references to type 1 (uncompressed) objects
    std::vector<QPDFObjGen> to_delete;
    for (auto const& iter: m->xref_table) {
        if (iter.second.getType() == 1) {
            to_delete.emplace_back(iter.first);
        }
    }
    for (auto const& iter: to_delete) {
        m->xref_table.erase(iter);
    }

    std::vector<std::tuple<int, int, qpdf_offset_t>> found_objects;
    std::vector<qpdf_offset_t> trailers;
    std::vector<qpdf_offset_t> startxrefs;

    m->file->seek(0, SEEK_END);
    qpdf_offset_t eof = m->file->tell();
    m->file->seek(0, SEEK_SET);
    // Don't allow very long tokens here during recovery. All the interesting tokens are covered.
    static size_t const MAX_LEN = 10;
    while (m->file->tell() < eof) {
        QPDFTokenizer::Token t1 = readToken(*m->file, MAX_LEN);
        qpdf_offset_t token_start = m->file->tell() - toO(t1.getValue().length());
        if (t1.isInteger()) {
            auto pos = m->file->tell();
            auto t2 = readToken(*m->file, MAX_LEN);
            if (t2.isInteger() && readToken(*m->file, MAX_LEN).isWord("obj")) {
                int obj = QUtil::string_to_int(t1.getValue().c_str());
                int gen = QUtil::string_to_int(t2.getValue().c_str());
                if (obj <= m->xref_table_max_id) {
                    found_objects.emplace_back(obj, gen, token_start);
                } else {
                    warn(damagedPDF(
                        "", -1, "ignoring object with impossibly large id " + std::to_string(obj)));
                }
            }
            m->file->seek(pos, SEEK_SET);
        } else if (!m->trailer && t1.isWord("trailer")) {
            trailers.emplace_back(m->file->tell());
        } else if (!found_startxref && t1.isWord("startxref")) {
            startxrefs.emplace_back(m->file->tell());
        }
        check_warnings();
        m->file->findAndSkipNextEOL();
    }

    if (!found_startxref && !startxrefs.empty() && !found_objects.empty() &&
        startxrefs.back() > std::get<2>(found_objects.back())) {
        try {
            m->file->seek(startxrefs.back(), SEEK_SET);
            if (auto offset = QUtil::string_to_ll(readToken(*m->file).getValue().data())) {
                read_xref(offset);
                if (getRoot().getKey("/Pages").isDictionary()) {
                    QTC::TC("qpdf", "QPDF startxref more than 1024 before end");
                    warn(damagedPDF(
                        "", -1, "startxref was more than 1024 bytes before end of file"));
                    initializeEncryption();
                    m->parsed = true;
                    m->reconstructed_xref = false;
                    return;
                }
            }
        } catch (...) {
            // ok, bad luck. Do recovery.
        }
    }

    auto rend = found_objects.rend();
    for (auto it = found_objects.rbegin(); it != rend; it++) {
        auto [obj, gen, token_start] = *it;
        insertXrefEntry(obj, 1, token_start, gen);
        check_warnings();
    }
    m->deleted_objects.clear();

    for (auto it = trailers.rbegin(); it != trailers.rend(); it++) {
        m->file->seek(*it, SEEK_SET);
        auto t = readTrailer();
        if (!t.isDictionary()) {
            // Oh well.  It was worth a try.
        } else {
            if (t.hasKey("/Root")) {
                m->trailer = t;
                break;
            }
            warn(damagedPDF("trailer", *it, "recovered trailer has no /Root entry"));
        }
        check_warnings();
    }

    if (!m->trailer) {
        qpdf_offset_t max_offset{0};
        size_t max_size{0};
        // If there are any xref streams, take the last one to appear.
        for (auto const& iter: m->xref_table) {
            auto entry = iter.second;
            if (entry.getType() != 1) {
                continue;
            }
            auto oh = getObject(iter.first);
            try {
                if (!oh.isStreamOfType("/XRef")) {
                    continue;
                }
            } catch (std::exception&) {
                continue;
            }
            auto offset = entry.getOffset();
            auto size = oh.getDict().getKey("/Size").getUIntValueAsUInt();
            if (size > max_size || (size == max_size && offset > max_offset)) {
                max_offset = offset;
                setTrailer(oh.getDict());
            }
            check_warnings();
        }
        if (max_offset > 0) {
            try {
                read_xref(max_offset);
            } catch (std::exception&) {
                warn(damagedPDF(
                    "", -1, "error decoding candidate xref stream while recovering damaged file"));
            }
            QTC::TC("qpdf", "QPDF recover xref stream");
        }
    }

    if (!m->trailer || (!m->parsed && !m->trailer.getKey("/Root").isDictionary())) {
        // Try to find a Root dictionary. As a quick fix try the one with the highest object id.
        QPDFObjectHandle root;
        for (auto const& iter: m->obj_cache) {
            try {
                if (QPDFObjectHandle(iter.second.object).isDictionaryOfType("/Catalog")) {
                    root = iter.second.object;
                }
            } catch (std::exception&) {
                continue;
            }
        }
        if (root) {
            if (!m->trailer) {
                warn(damagedPDF(
                    "", -1, "unable to find trailer dictionary while recovering damaged file"));
                m->trailer = QPDFObjectHandle::newDictionary();
            }
            m->trailer.replaceKey("/Root", root);
        }
    }

    if (!m->trailer) {
        // We could check the last encountered object to see if it was an xref stream.  If so, we
        // could try to get the trailer from there.  This may make it possible to recover files with
        // bad startxref pointers even when they have object streams.

        throw damagedPDF("", -1, "unable to find trailer dictionary while recovering damaged file");
    }
    if (m->xref_table.empty()) {
        // We cannot check for an empty xref table in parse because empty tables are valid when
        // creating QPDF objects from JSON.
        throw damagedPDF("", -1, "unable to find objects while recovering damaged file");
    }
    check_warnings();
    if (!m->parsed) {
        m->parsed = true;
        getAllPages();
        check_warnings();
        if (m->all_pages.empty()) {
            m->parsed = false;
            throw damagedPDF("", -1, "unable to find any pages while recovering damaged file");
        }
    }
    // We could iterate through the objects looking for streams and try to find objects inside of
    // them, but it's probably not worth the trouble.  Acrobat can't recover files with any errors
    // in an xref stream, and this would be a real long shot anyway.  If we wanted to do anything
    // that involved looking at stream contents, we'd also have to call initializeEncryption() here.
    // It's safe to call it more than once.
}